

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Printer::RegisterFieldValuePrinter
          (Printer *this,FieldDescriptor *field,FastFieldValuePrinter *printer)

{
  pointer ppVar1;
  __enable_if_t<is_constructible<value_type,_pair<const_FieldDescriptor_*,_std::nullptr_t>_>::value,_pair<iterator,_bool>_>
  _Var2;
  pair<const_google::protobuf::FieldDescriptor_*,_std::nullptr_t> local_48;
  _Rb_tree_iterator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>
  local_38;
  __enable_if_t<is_constructible<value_type,_pair<const_FieldDescriptor_*,_std::nullptr_t>_>::value,_pair<iterator,_bool>_>
  pair;
  FastFieldValuePrinter *printer_local;
  FieldDescriptor *field_local;
  Printer *this_local;
  
  if ((field == (FieldDescriptor *)0x0) || (printer == (FastFieldValuePrinter *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    pair._8_8_ = printer;
    printer_local = (FastFieldValuePrinter *)field;
    field_local = (FieldDescriptor *)this;
    std::make_pair<google::protobuf::FieldDescriptor_const*&,decltype(nullptr)>
              (&local_48.first,&printer_local);
    _Var2 = std::
            map<google::protobuf::FieldDescriptor_const*,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>>>
            ::insert<std::pair<google::protobuf::FieldDescriptor_const*,decltype(nullptr)>>
                      ((map<google::protobuf::FieldDescriptor_const*,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>>>
                        *)&this->custom_printers_,&local_48);
    local_38 = _Var2.first._M_node;
    pair.first._M_node._0_1_ = _Var2.second;
    if (((undefined1  [16])_Var2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      this_local._7_1_ = false;
    }
    else {
      ppVar1 = std::
               _Rb_tree_iterator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>
               ::operator->(&local_38);
      std::
      unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
      ::reset(&ppVar1->second,(pointer)pair._8_8_);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool TextFormat::Printer::RegisterFieldValuePrinter(
    const FieldDescriptor* field, const FastFieldValuePrinter* printer) {
  if (field == nullptr || printer == nullptr) {
    return false;
  }
  auto pair = custom_printers_.insert(std::make_pair(field, nullptr));
  if (pair.second) {
    pair.first->second.reset(printer);
    return true;
  } else {
    return false;
  }
}